

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

CopyConst<const_char,_ElementType<4UL>_> * __thiscall
absl::lts_20250127::container_internal::internal_layout::
LayoutImpl<std::tuple<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,false>>*,unsigned_int,unsigned_char,absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,int>,absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,false>>*>,std::integer_sequence<unsigned_long,1ul,0ul,4ul,6ul,7ul>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
::Pointer<4ul,char_const>
          (LayoutImpl<std::tuple<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,false>>*,unsigned_int,unsigned_char,absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,int>,absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>,256,false>>*>,std::integer_sequence<unsigned_long,1ul,0ul,4ul,6ul,7ul>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
           *this,char *p)

{
  size_t sVar1;
  size_t alignment;
  char *p_local;
  LayoutImpl<std::tuple<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>_*,_unsigned_int,_unsigned_char,_absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_1UL,_0UL,_4UL,_6UL,_7UL>,_std::integer_sequence<unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>_>
  *this_local;
  
  if (((ulong)p & 7) == 0) {
    sVar1 = LayoutImpl<std::tuple<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>_*,_unsigned_int,_unsigned_char,_absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_1UL,_0UL,_4UL,_6UL,_7UL>,_std::integer_sequence<unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>_>
            ::Offset<4UL,_0>((LayoutImpl<std::tuple<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>_*,_unsigned_int,_unsigned_char,_absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_1UL,_0UL,_4UL,_6UL,_7UL>,_std::integer_sequence<unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>_>
                              *)this);
    return (CopyConst<const_char,_ElementType<4UL>_> *)(p + sVar1);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, int>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, int>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, int, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 4UL, Char = const char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
    using C = typename std::remove_const<Char>::type;
    static_assert(
        std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
        "The argument must be a pointer to [const] [signed|unsigned] char");
    constexpr size_t alignment = Alignment();
    (void)alignment;
    assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
    return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
  }